

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFurnitureType::IfcFurnitureType(IfcFurnitureType *this)

{
  IfcFurnitureType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcFurnitureType");
  IfcFurnishingElementType::IfcFurnishingElementType
            ((IfcFurnishingElementType *)this,&PTR_construction_vtable_24__010e5b30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>,
             &PTR_construction_vtable_24__010e5c68);
  *(undefined8 *)this = 0x10e5a00;
  *(undefined8 *)&this->field_0x1c0 = 0x10e5b18;
  *(undefined8 *)&this->field_0x88 = 0x10e5a28;
  *(undefined8 *)&this->field_0x98 = 0x10e5a50;
  *(undefined8 *)&this->field_0xf0 = 0x10e5a78;
  *(undefined8 *)&this->field_0x148 = 0x10e5aa0;
  *(undefined8 *)&this->field_0x180 = 0x10e5ac8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x10e5af0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFurnitureType,_1UL>).field_0x10)
  ;
  return;
}

Assistant:

IfcFurnitureType() : Object("IfcFurnitureType") {}